

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

TRef snap_pref(jit_State *J,GCtrace *T,SnapEntry *map,MSize nmax,BloomFilter seen,IRRef ref)

{
  GCRef *pGVar1;
  byte bVar2;
  uint uVar3;
  TRef TVar4;
  ulong uVar5;
  
  pGVar1 = &T->nextgc + ref;
  if (ref < 0x8000) {
    bVar2 = *(byte *)((long)&pGVar1->gcptr64 + 5);
    uVar3 = 0x7fff;
    switch(bVar2) {
    case 0x16:
      uVar3 = *(byte *)((long)&pGVar1->gcptr64 + 4) & 0x1f;
      uVar3 = (uVar3 << 0x18 | uVar3) ^ 0x7fff;
      break;
    case 0x17:
      TVar4 = lj_ir_kint(J,(int32_t)pGVar1->gcptr64);
      return TVar4;
    case 0x18:
      TVar4 = lj_ir_kgc(J,*(GCobj **)(pGVar1 + 1),(uint)*(byte *)((long)&pGVar1->gcptr64 + 4));
      return TVar4;
    case 0x19:
      TVar4 = lj_ir_kptr_(J,IR_KPTR,*(void **)(pGVar1 + 1));
      return TVar4;
    case 0x1c:
    case 0x1d:
      TVar4 = lj_ir_k64(J,(uint)bVar2,pGVar1[1].gcptr64);
      return TVar4;
    }
    return uVar3;
  }
  if ((pGVar1->gcptr64 & 0xff80000000000000) == 0x80000000000000) {
    return 0;
  }
  if ((nmax != 0) && ((1L << ((byte)ref & 0x3f) & seen) != 0)) {
    uVar5 = 0;
    do {
      if ((map[uVar5] & 0xffff) == ref) {
        uVar3 = J->slot[map[uVar5] >> 0x18] & 0xffecffff;
        if (uVar3 != 0) {
          return uVar3;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while (nmax != uVar5);
  }
  (J->fold).ins.field_0.ot = *(byte *)((long)&pGVar1->gcptr64 + 4) & 0x1f | 0xe00;
  (J->fold).ins.field_0.op1 = (ushort)ref ^ 0x8000;
  (J->fold).ins.field_0.op2 = 0;
  TVar4 = lj_opt_fold(J);
  return TVar4;
}

Assistant:

static TRef snap_pref(jit_State *J, GCtrace *T, SnapEntry *map, MSize nmax,
		      BloomFilter seen, IRRef ref)
{
  IRIns *ir = &T->ir[ref];
  TRef tr;
  if (irref_isk(ref))
    tr = snap_replay_const(J, ir);
  else if (!regsp_used(ir->prev))
    tr = 0;
  else if (!bloomtest(seen, ref) || (tr = snap_dedup(J, map, nmax, ref)) == 0)
    tr = emitir(IRT(IR_PVAL, irt_type(ir->t)), ref - REF_BIAS, 0);
  return tr;
}